

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_45a12::MapDriver::reset(MapDriver *this)

{
  long *in_RDI;
  float fVar1;
  Vec3 VVar2;
  float d;
  float s;
  MapDriver *in_stack_ffffffffffffff30;
  undefined8 local_b0;
  float local_a8;
  undefined8 local_9c;
  float local_94;
  undefined8 local_90;
  SimpleVehicle *in_stack_ffffffffffffff80;
  Vec3 local_5c;
  float local_50;
  float local_4c;
  undefined8 local_48;
  undefined4 in_stack_ffffffffffffffc4;
  
  OpenSteer::SimpleVehicle::reset(in_stack_ffffffffffffff80);
  (**(code **)(*in_RDI + 0xe0))(0);
  (**(code **)(*in_RDI + 0x108))(0x41a00000);
  fVar1 = (float)(**(code **)(*in_RDI + 0x100))();
  (**(code **)(*in_RDI + 0xf8))(fVar1 * 0.4);
  *(undefined4 *)(in_RDI + 0x20) = 0x3f800000;
  *(undefined4 *)((long)in_RDI + 0x104) = 0x3fc00000;
  adjustVehicleRadiusForSpeed(in_stack_ffffffffffffff30);
  OpenSteer::Vec3::operator=((Vec3 *)((long)in_RDI + 300),&OpenSteer::Vec3::zero);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  clearTrailHistory((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                    0x137a41);
  *(undefined1 *)((long)in_RDI + 0x13a) = 0;
  VVar2 = OpenSteer::Vec3::operator=((Vec3 *)(in_RDI + 0x29),&OpenSteer::Vec3::zero);
  local_48 = VVar2._0_8_;
  fVar1 = VVar2.z;
  *(undefined4 *)((long)in_RDI + 0xfc) = 0x40400000;
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    *(int *)((long)in_RDI + 0x154) = *(int *)((long)in_RDI + 0x154) + 1;
    local_4c = (anonymous_namespace)::MapDriver::worldSize;
    local_50 = (float)(int)in_RDI[0x1f];
    OpenSteer::Vec3::Vec3
              (&local_5c,(anonymous_namespace)::MapDriver::worldSize * local_50 * 0.6,0.0,
               (anonymous_namespace)::MapDriver::worldSize * -0.4);
    local_90 = (**(code **)(*in_RDI + 0x48))(local_5c._0_8_);
    VVar2 = OpenSteer::Vec3::operator*
                      ((Vec3 *)in_stack_ffffffffffffff30,(float)((ulong)in_RDI >> 0x20));
    local_b0 = VVar2._0_8_;
    local_9c = local_b0;
    local_a8 = VVar2.z;
    local_94 = local_a8;
    (**(code **)(*in_RDI + 0x88))(in_RDI,&local_9c);
  }
  resetStuckCycleDetection((MapDriver *)CONCAT44(in_stack_ffffffffffffffc4,fVar1));
  OpenSteer::Vec3::operator=((Vec3 *)(in_RDI + 0x2d),&OpenSteer::Vec3::zero);
  *(undefined1 *)(in_RDI + 0x25) = 0;
  *(undefined1 *)((long)in_RDI + 0x15c) = 0;
  return;
}

Assistant:

void reset (void)
        {
            // reset the underlying vehicle class
            SimpleVehicle::reset ();

            // initially stopped
            setSpeed (0);

            // Assume top speed is 20 meters per second (44.7 miles per hour).
            // This value will eventually be supplied by a higher level module.
            setMaxSpeed (20);

            // steering force is clipped to this magnitude
            setMaxForce (maxSpeed () * 0.4f);

            // vehicle is 2 meters wide and 3 meters long
            halfWidth = 1.0f;
            halfLength = 1.5f;

            // init dynamically controlled radius
            adjustVehicleRadiusForSpeed ();

            // not previously avoiding
            annotateAvoid = Vec3::zero;

            // prevent long streaks due to teleportation 
            clearTrailHistory ();

            // first pass at detecting "stuck" state
            stuck = false;

            // QQQ need to clean up this hack
            qqqLastNearestObstacle = Vec3::zero;

            // master look ahead (prediction) time
            baseLookAheadTime = 3;

            if (demoSelect == 2)
            {
                lapsStarted++;
                const float s = worldSize;
                const float d = (float) pathFollowDirection;
                setPosition (Vec3 (s * d * 0.6f, 0, s * -0.4f));
                regenerateOrthonormalBasisUF (Vec3::side * d);
            }

            // reset bookeeping to detect stuck cycles
            resetStuckCycleDetection ();

            // assume no previous steering
            currentSteering = Vec3::zero;

            // assume normal running state
            dtZero = false;

            // QQQ temporary global QQQoaJustScraping
            QQQoaJustScraping = false;

            // state saved for speedometer
    //      annoteMaxRelSpeed = annoteMaxRelSpeedCurve = annoteMaxRelSpeedPath = 0;
    //      annoteMaxRelSpeed = annoteMaxRelSpeedCurve = annoteMaxRelSpeedPath = 1;
        }